

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

string * __thiscall
enact::AstSerialise::visitCastExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,CastExpr *expr)

{
  Expr *pEVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  ulong *puVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"(",&(expr->oper).lexeme);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_b0 = *puVar6;
    uStack_a8 = (undefined4)plVar4[3];
    uStack_a4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar6;
    local_c0 = (ulong *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pEVar1 = (expr->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&local_a0,pEVar1,&this->field_0x8);
  uVar9 = 0xf;
  if (local_c0 != &local_b0) {
    uVar9 = local_b0;
  }
  if (uVar9 < (ulong)(local_98 + local_b8)) {
    uVar9 = 0xf;
    if (local_a0 != local_90) {
      uVar9 = local_90[0];
    }
    if ((ulong)(local_98 + local_b8) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_0011b52d;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
LAB_0011b52d:
  local_e0 = &local_d0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_d0 = *plVar4;
    uStack_c8 = puVar5[3];
  }
  else {
    local_d0 = *plVar4;
    local_e0 = (long *)*puVar5;
  }
  local_d8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_70 = *plVar7;
    uStack_68 = (undefined4)plVar4[3];
    uStack_64 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar7;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  iVar3 = (*((expr->typename_)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,*(ulong *)CONCAT44(extraout_var,iVar3));
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_50 = *plVar7;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar7;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitCastExpr(CastExpr& expr) {
        return "(" + expr.oper.lexeme + " " + visitExpr(*expr.expr) + " " + expr.typename_->name() + ")";
    }